

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSupMin.c
# Opt level: O1

void Gia_ManSupExperiment(Gia_Man_t *pGia,Vec_Int_t *vPairs)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  Gia_ManSup_t *p;
  int iVar9;
  Gia_ManSup_t *pGVar10;
  long lVar11;
  ulong uVar12;
  
  pGVar10 = (Gia_ManSup_t *)&DAT_00000010;
  p = Gia_ManSupStart(0x10);
  p->pGia = pGia;
  if ((vPairs->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSupMin.c"
                  ,0x94,"void Gia_ManSupExperiment(Gia_Man_t *, Vec_Int_t *)");
  }
  if (1 < vPairs->nSize) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      Abc_Print((int)pGVar10,"%6d : ",uVar12 & 0xffffffff);
      if (vPairs->nSize <= lVar11) {
LAB_00727e41:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = vPairs->pArray[uVar12 * 2];
      iVar4 = pGia->vCos->nSize;
      iVar9 = iVar4 - pGia->nRegs;
      if (iVar9 <= (int)uVar3) {
LAB_00727e7f:
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar3 < 0) || (iVar4 <= (int)uVar3)) goto LAB_00727e41;
      piVar6 = pGia->vCos->pArray;
      iVar5 = piVar6[uVar3];
      if (((long)iVar5 < 0) || (pGia->nObjs <= iVar5)) {
LAB_00727e60:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((long)vPairs->nSize <= lVar11 + 1) goto LAB_00727e41;
      uVar3 = vPairs->pArray[uVar12 * 2 + 1];
      if (iVar9 <= (int)uVar3) goto LAB_00727e7f;
      if (((int)uVar3 < 0) || (iVar4 <= (int)uVar3)) goto LAB_00727e41;
      iVar4 = piVar6[uVar3];
      if (((long)iVar4 < 0) || (pGia->nObjs <= iVar4)) goto LAB_00727e60;
      pGVar1 = pGia->pObjs + iVar5;
      pGVar2 = pGia->pObjs + iVar4;
      uVar7 = *(ulong *)pGVar1;
      uVar8 = *(ulong *)pGVar2;
      pGVar10 = p;
      Gia_ManSupExperimentOne
                (p,(Gia_Obj_t *)
                   ((ulong)((uint)(uVar7 >> 0x1d) & 1) ^ (ulong)(pGVar1 + -(uVar7 & 0x1fffffff))),
                 (Gia_Obj_t *)
                 ((ulong)((uint)(uVar8 >> 0x1d) & 1) ^ (ulong)(pGVar2 + -(uVar8 & 0x1fffffff))));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 2;
    } while ((long)uVar12 < (long)(vPairs->nSize / 2));
  }
  Gia_ManSupStop(p);
  return;
}

Assistant:

void Gia_ManSupExperiment( Gia_Man_t * pGia, Vec_Int_t * vPairs )
{
    Gia_ManSup_t * p;
    Gia_Obj_t * pData, * pCare;
    int i;
    p = Gia_ManSupStart( 16 );
    p->pGia = pGia;
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    for ( i = 0; i < Vec_IntSize(vPairs)/2; i++ )
    {
        Abc_Print( 1, "%6d : ", i );
        pData = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+0) );
        pCare = Gia_ManPo( pGia, Vec_IntEntry(vPairs, 2*i+1) );
        Gia_ManSupExperimentOne( p, Gia_ObjChild0(pData), Gia_ObjChild0(pCare) );
    }
    Gia_ManSupStop( p );
}